

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  time_t tVar1;
  time_t tVar2;
  char *pcVar3;
  ostream *poVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test DNN begin\n",0xf);
  tfs::randomSeed(0x400);
  tVar1 = time((time_t *)0x0);
  testMatrix();
  testBuilder();
  testFullyConnected();
  testCifar10();
  testSimple();
  testCircle();
  testSpiral();
  test2Layer();
  testIO();
  tVar2 = time((time_t *)0x0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Test DNN end. Elapsed time: ",0x1c);
  poVar4 = (ostream *)&std::cout;
  if (tVar2 - tVar1 == 1) {
    pcVar3 = "1 second.\n";
  }
  else {
    poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
    pcVar3 = " seconds.\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,10);
  return 0;
}

Assistant:

int
main( int argc, const char * argv[] ) {
    std::cout << "Test DNN begin\n";
    
    tfs::randomSeed( 1024 );    // Consistent behavior during testing.  Effects DNN initialization.

    const time_t startTime = time( 0 );
    
    testMatrix();
    testBuilder();
    testFullyConnected();
    testCifar10();
    testSimple();
    testCircle();
    testSpiral();               // testSpiral may take a a few minutes, depending on your computer.
    test2Layer();
    testIO();
    
    const time_t endTime     = time( 0 );
    const time_t elapsedTime = endTime - startTime;
    
    std::cout << "Test DNN end. Elapsed time: ";
    if( elapsedTime == 1 ) {
       std::cout << "1 second.\n";
    } else {
        std::cout << elapsedTime << " seconds.\n";  // From my 2009 MacBook pro: Elapsed time: 15 seconds.
    }
    return 0;
    
}